

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::RequiresError::RequiresError(RequiresError *this,string *curname,string *subname)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *subname_local;
  string *curname_local;
  RequiresError *this_local;
  
  local_20 = subname;
  subname_local = curname;
  curname_local = (string *)this;
  ::std::operator+(&local_60,curname," requires ");
  ::std::operator+(&local_40,&local_60,subname);
  RequiresError(this,&local_40,RequiresError);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}